

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md4c.c
# Opt level: O3

int md_process_table_cell
              (MD_CTX *ctx,MD_BLOCKTYPE cell_type,MD_ALIGN align,MD_OFFSET beg,MD_OFFSET end)

{
  int iVar1;
  byte *pbVar2;
  _func_void_char_ptr_void_ptr *p_Var3;
  void *pvVar4;
  char *pcVar5;
  MD_OFFSET MVar6;
  MD_BLOCK_TD_DETAIL det;
  MD_LINE line;
  MD_ALIGN local_24;
  MD_LINE local_20;
  
  local_20.end = end;
  if (beg < end) {
    pbVar2 = (byte *)(ctx->text + beg);
    do {
      if ((0x20 < (ulong)*pbVar2) || ((0x100001a00U >> ((ulong)*pbVar2 & 0x3f) & 1) == 0))
      goto LAB_00109b5a;
      beg = beg + 1;
      pbVar2 = pbVar2 + 1;
      local_20.beg = end;
    } while (end != beg);
  }
  else {
LAB_00109b5a:
    local_20.beg = beg;
    if (beg < end) {
      pbVar2 = (byte *)(ctx->text + (end - 1));
      MVar6 = end;
      do {
        local_20.end = MVar6;
        if ((0x20 < (ulong)*pbVar2) || ((0x100001a00U >> ((ulong)*pbVar2 & 0x3f) & 1) == 0)) break;
        MVar6 = local_20.end - 1;
        pbVar2 = pbVar2 + -1;
        local_20.end = beg;
      } while (beg < MVar6);
    }
  }
  local_24 = align;
  iVar1 = (*(ctx->parser).enter_block)(cell_type,&local_24,ctx->userdata);
  if (iVar1 == 0) {
    iVar1 = md_process_normal_block_contents(ctx,&local_20,1);
    if (iVar1 < 0) {
      return iVar1;
    }
    iVar1 = (*(ctx->parser).leave_block)(cell_type,&local_24,ctx->userdata);
    if (iVar1 == 0) {
      return 0;
    }
    p_Var3 = (ctx->parser).debug_log;
    if (p_Var3 == (_func_void_char_ptr_void_ptr *)0x0) {
      return iVar1;
    }
    pvVar4 = ctx->userdata;
    pcVar5 = "Aborted from leave_block() callback.";
  }
  else {
    p_Var3 = (ctx->parser).debug_log;
    if (p_Var3 == (_func_void_char_ptr_void_ptr *)0x0) {
      return iVar1;
    }
    pvVar4 = ctx->userdata;
    pcVar5 = "Aborted from enter_block() callback.";
  }
  (*p_Var3)(pcVar5,pvVar4);
  return iVar1;
}

Assistant:

static int
md_process_table_cell(MD_CTX* ctx, MD_BLOCKTYPE cell_type, MD_ALIGN align, OFF beg, OFF end)
{
    MD_LINE line;
    MD_BLOCK_TD_DETAIL det;
    int ret = 0;

    while(beg < end  &&  ISWHITESPACE(beg))
        beg++;
    while(end > beg  &&  ISWHITESPACE(end-1))
        end--;

    det.align = align;
    line.beg = beg;
    line.end = end;

    MD_ENTER_BLOCK(cell_type, &det);
    MD_CHECK(md_process_normal_block_contents(ctx, &line, 1));
    MD_LEAVE_BLOCK(cell_type, &det);

abort:
    return ret;
}